

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  QVBoxLayout *this;
  Meter *this_00;
  QSlider *this_01;
  undefined4 *puVar2;
  QString local_90;
  QObject local_78 [12];
  int argc_local;
  QApplication app;
  code *local_58;
  ImplFn local_50;
  QWidget w;
  
  argc_local = argc;
  QApplication::QApplication(&app,&argc_local,argv,0x60204);
  QWidget::QWidget(&w,0,0);
  this = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this,&w);
  this_00 = (Meter *)operator_new(0x30);
  Meter::Meter(this_00,&w);
  Meter::setMinValue(this_00,0.0);
  Meter::setMaxValue(this_00,220.0);
  Meter::setValue(this_00,90.0);
  QColor::QColor((QColor *)&local_90,black);
  Meter::setBackgroundColor(this_00,(QColor *)&local_90);
  QColor::QColor((QColor *)&local_90,blue);
  Meter::setNeedleColor(this_00,(QColor *)&local_90);
  QColor::QColor((QColor *)&local_90,white);
  Meter::setTextColor(this_00,(QColor *)&local_90);
  QColor::QColor((QColor *)&local_90,white);
  Meter::setGridColor(this_00,(QColor *)&local_90);
  local_90.d.d = (Data *)0x0;
  local_90.d.ptr = L"speed";
  local_90.d.size = 5;
  Meter::setLabel(this_00,&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
    }
  }
  local_90.d.d = (Data *)0x0;
  local_90.d.ptr = L"km/h";
  local_90.d.size = 4;
  Meter::setUnitsLabel(this_00,&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
    }
  }
  Meter::setRadius(this_00,200);
  Meter::setStartScaleAngle(this_00,0x23);
  Meter::setStopScaleAngle(this_00,0x145);
  Meter::setScaleStep(this_00,2.0);
  Meter::setScaleGridStep(this_00,10.0);
  Meter::setDrawValue(this_00,true);
  Meter::setDrawGridValues(this_00,true);
  Meter::setDrawValuePrecision(this_00,0);
  Meter::setScaleLabelPrecision(this_00,0);
  QColor::QColor((QColor *)&local_90,transparent);
  Meter::setThresholdRange(this_00,0.0,110.0,0,(QColor *)&local_90);
  QColor::QColor((QColor *)&local_90,yellow);
  Meter::setThresholdRange(this_00,110.0,130.0,1,(QColor *)&local_90);
  QColor::QColor((QColor *)&local_90,red);
  Meter::setThresholdRange(this_00,130.0,220.1,2,(QColor *)&local_90);
  QBoxLayout::addWidget(this,this_00,0,0);
  this_01 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(this_01,Horizontal,&w);
  iVar1 = (int)this_01;
  QAbstractSlider::setMinimum(iVar1);
  QAbstractSlider::setMaximum(iVar1);
  QAbstractSlider::setValue(iVar1);
  QBoxLayout::addWidget(this,this_01,0,0);
  local_90.d.d = (Data *)QAbstractSlider::valueChanged;
  local_90.d.ptr = (char16_t *)0x0;
  local_58 = Meter::setValue;
  local_50 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(Meter::*)(double),_QtPrivate::List<int>,_void>::impl;
  *(code **)(puVar2 + 4) = Meter::setValue;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_78,(void **)this_01,(QObject *)&local_90,(void **)this_00,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  QWidget::show();
  iVar1 = QApplication::exec();
  QWidget::~QWidget(&w);
  QApplication::~QApplication(&app);
  return iVar1;
}

Assistant:

int main( int argc, char ** argv )
{
	QApplication app( argc, argv );

	QWidget w;

	auto * l = new QVBoxLayout( &w );

	auto * m = new Meter( &w );

	m->setMinValue( 0.0 );
	m->setMaxValue( 220.0 );
	m->setValue( 90.0 );
	m->setBackgroundColor( Qt::black );
	m->setNeedleColor( Qt::blue );
	m->setTextColor( Qt::white );
	m->setGridColor( Qt::white );
	m->setLabel( QStringLiteral( "speed" ) );
	m->setUnitsLabel( QStringLiteral( "km/h" ) );
	m->setRadius( 200 );
	m->setStartScaleAngle( 35 );
	m->setStopScaleAngle( 325 );
	m->setScaleStep( 2.0 );
	m->setScaleGridStep( 10.0 );
	m->setDrawValue( true );
	m->setDrawGridValues( true );
	m->setDrawValuePrecision( 0 );
	m->setScaleLabelPrecision( 0 );
	m->setThresholdRange( 0, 110.0, 0 );
	m->setThresholdRange( 110.0, 130.0, 1, Qt::yellow );
	m->setThresholdRange( 130.0, 220.1, 2, Qt::red );

	l->addWidget( m );

	auto * s = new QSlider( Qt::Horizontal, &w );
	s->setMinimum( 0 );
	s->setMaximum( 220 );
	s->setValue( 90 );

	l->addWidget( s );

	QObject::connect( s, &QSlider::valueChanged, m, &Meter::setValue );

	w.show();

	return QApplication::exec();
}